

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O0

ColMatrix * __thiscall fizplex::Base::get_inverse(Base *this)

{
  bool bVar1;
  reference pNVar2;
  vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *in_RSI;
  ColMatrix *in_RDI;
  SVector *in_stack_00000010;
  ETM *in_stack_00000018;
  Base *in_stack_00000020;
  Nonzero *n;
  iterator __end2;
  iterator __begin2;
  SVector *__range2;
  size_t col;
  size_t i;
  size_t ind;
  ColMatrix *inv;
  SVector *in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff60;
  __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
  local_50;
  SVector *local_48;
  pointer local_40;
  pointer local_28;
  pointer local_20;
  undefined1 local_11;
  
  local_11 = 0;
  ColMatrix::identity((size_t)in_RDI);
  for (local_20 = (pointer)0x0;
      local_20 <
      in_RSI[2].super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
      super__Vector_impl_data._M_start;
      local_20 = (pointer)((long)&(local_20->eta).values.
                                  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          + 1)) {
    for (local_28 = (pointer)0x0;
        local_28 <
        in_RSI[2].super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>.
        _M_impl.super__Vector_impl_data._M_start;
        local_28 = (pointer)((long)&(local_28->eta).values.
                                    super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                            + 1)) {
      std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::operator[]
                (in_RSI,(size_type)local_20);
      ColMatrix::column((ColMatrix *)in_stack_ffffffffffffff60._M_current,
                        (size_t)in_stack_ffffffffffffff58);
      apply_etm(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    }
  }
  for (local_40 = (pointer)0x0;
      local_40 <
      in_RSI[2].super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
      super__Vector_impl_data._M_start;
      local_40 = (pointer)((long)&(local_40->eta).values.
                                  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          + 1)) {
    local_48 = ColMatrix::column((ColMatrix *)in_stack_ffffffffffffff60._M_current,
                                 (size_t)in_stack_ffffffffffffff58);
    local_50._M_current = (Nonzero *)SVector::begin(in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff60 = SVector::end(in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                               *)in_stack_ffffffffffffff60._M_current,
                              (__normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      pNVar2 = __gnu_cxx::
               __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
               ::operator*(&local_50);
      in_stack_ffffffffffffff58 =
           (SVector *)
           std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                     ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                      in_stack_ffffffffffffff60._M_current,(size_t)in_stack_ffffffffffffff58);
      pNVar2->index =
           (size_t)(in_stack_ffffffffffffff58->values).
                   super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      __gnu_cxx::
      __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
      ::operator++(&local_50);
    }
  }
  return in_RDI;
}

Assistant:

ColMatrix Base::get_inverse() {
  auto inv = ColMatrix::identity(m);
  for (size_t ind = 0; ind < m; ++ind) {
    for (size_t i = 0; i < m; ++i)
      apply_etm(etms[ind], inv.column(i));
  }

  for (size_t col = 0; col < m; ++col) {
    for (auto &n : inv.column(col))
      n.index = row_ordering[n.index];
  }
  return inv;
}